

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

size_t __thiscall ot::commissioner::coap::Message::GetHeaderLength(Message *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  size_type sVar1;
  ErrorCode local_64;
  undefined1 local_5d;
  bool condition;
  undefined1 local_50 [8];
  Error error;
  ByteArray buf;
  Message *this_local;
  
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            ((long)&error.mMessage.field_2 + 8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this_00);
  Serialize((Error *)local_50,this,&this->mHeader,this_00);
  local_64 = kNone;
  local_5d = commissioner::operator==((Error *)local_50,&local_64);
  if ((bool)local_5d) {
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       ((long)&error.mMessage.field_2 + 8));
    Error::~Error((Error *)local_50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&error.mMessage.field_2 + 8));
    return sVar1;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap.cpp"
                ,0xb9,"size_t ot::commissioner::coap::Message::GetHeaderLength() const");
}

Assistant:

size_t Message::GetHeaderLength() const
{
    ByteArray buf;
    Error     error = Serialize(mHeader, buf);

    ASSERT(error == ErrorCode::kNone);
    return buf.size();
}